

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

uint __thiscall
crnlib::
hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
::find_index(hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
             *this,cluster_id *k)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  cluster_id *pcStack_30;
  int orig_index;
  node *pNode;
  int index;
  cluster_id *k_local;
  hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
  *this_local;
  
  if (this->m_num_valid != 0) {
    uVar2 = hash_key(this,k);
    pcStack_30 = (cluster_id *)get_node(this,uVar2);
    if (*(char *)((long)&pcStack_30[1].m_cells.m_p + 4) != '\0') {
      bVar1 = equal_to<crnlib::qdxt1::cluster_id>::operator()
                        ((equal_to<crnlib::qdxt1::cluster_id> *)&this->field_0x15,pcStack_30,k);
      pNode._4_4_ = uVar2;
      if (bVar1) {
        return uVar2;
      }
      while( true ) {
        if (pNode._4_4_ == 0) {
          uVar3 = vector<crnlib::hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>::raw_node>
                  ::size(&this->m_values);
          pNode._4_4_ = uVar3 - 1;
          pcStack_30 = (cluster_id *)get_node(this,pNode._4_4_);
        }
        else {
          pNode._4_4_ = pNode._4_4_ - 1;
          pcStack_30 = (cluster_id *)&pcStack_30[-2].m_hash;
        }
        if ((pNode._4_4_ == uVar2) || (*(char *)((long)&pcStack_30[1].m_cells.m_p + 4) == '\0'))
        break;
        bVar1 = equal_to<crnlib::qdxt1::cluster_id>::operator()
                          ((equal_to<crnlib::qdxt1::cluster_id> *)&this->field_0x15,pcStack_30,k);
        if (bVar1) {
          return pNode._4_4_;
        }
      }
    }
  }
  uVar2 = vector<crnlib::hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>::raw_node>
          ::size(&this->m_values);
  return uVar2;
}

Assistant:

inline uint find_index(const Key& k) const
        {
            if (m_num_valid)
            {
                int index = hash_key(k);
                const node* pNode = &get_node(index);

                if (pNode->state)
                {
                    if (m_equals(pNode->first, k))
                    {
                        return index;
                    }

                    const int orig_index = index;

                    for (;;)
                    {
                        if (!index)
                        {
                            index = m_values.size() - 1;
                            pNode = &get_node(index);
                        }
                        else
                        {
                            index--;
                            pNode--;
                        }

                        if (index == orig_index)
                        {
                            break;
                        }

                        if (!pNode->state)
                        {
                            break;
                        }

                        if (m_equals(pNode->first, k))
                        {
                            return index;
                        }
                    }
                }
            }

            return m_values.size();
        }